

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

uint my_rand(uint max)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint result;
  uint s1;
  uint s0;
  uint max_local;
  
  uVar1 = rng_state[0] * -0x3910c8a0;
  uVar3 = rng_state[0] * -0x61c88645;
  uVar2 = rng_state[0] ^ rng_state[1];
  rng_state[0] = (rng_state[0] << 0x1a | rng_state[0] >> 6) ^ uVar2 ^ uVar2 << 9;
  rng_state[1] = uVar2 << 0xd | uVar2 >> 0x13;
  return ((uVar1 | uVar3 >> 0x1b) * 5) % max;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
my_rand(unsigned max) {
    unsigned s0 = rng_state[0];
    unsigned s1 = rng_state[1];
    unsigned result = HASH_ROL(s0 * 0x9E3779BB, 5) * 5;

    s1 ^= s0;
    rng_state[0] = HASH_ROL(s0, 26) ^ s1 ^ (s1 << 9);
    rng_state[1] = HASH_ROL(s1, 13);

    return((result & 0xFFFFFFFF) % max);
}